

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::EagerPromiseNodeBase::EagerPromiseNodeBase
          (EagerPromiseNodeBase *this,Own<kj::_::PromiseNode> *dependencyParam,
          ExceptionOrValue *resultRef)

{
  Own<kj::_::PromiseNode> *other;
  PromiseNode *pPVar1;
  ExceptionOrValue *resultRef_local;
  Own<kj::_::PromiseNode> *dependencyParam_local;
  EagerPromiseNodeBase *this_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  Event::Event(&this->super_Event);
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_007d8990;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_007d89c8;
  other = mv<kj::Own<kj::_::PromiseNode>>(dependencyParam);
  Own<kj::_::PromiseNode>::Own(&this->dependency,other);
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  this->resultRef = resultRef;
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->dependency);
  (*pPVar1->_vptr_PromiseNode[1])();
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->dependency);
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

EagerPromiseNodeBase::EagerPromiseNodeBase(
    Own<PromiseNode>&& dependencyParam, ExceptionOrValue& resultRef)
    : dependency(kj::mv(dependencyParam)), resultRef(resultRef) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}